

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydata.h
# Opt level: O0

pair<QTypedArrayData<QShaderDescription::InOutVariable>_*,_QShaderDescription::InOutVariable_*>
QTypedArrayData<QShaderDescription::InOutVariable>::allocate
          (qsizetype capacity,AllocationOption option)

{
  pair<QTypedArrayData<QShaderDescription::InOutVariable>_*,_QShaderDescription::InOutVariable_*>
  pVar1;
  AllocationOption in_ESI;
  longlong in_RDI;
  long in_FS_OFFSET;
  void *result;
  QArrayData *d;
  InOutVariable *local_30;
  QArrayData *local_28;
  QArrayData *local_20;
  pair<QTypedArrayData<QShaderDescription::InOutVariable>_*,_QShaderDescription::InOutVariable_*>
  local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_20 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
  local_30 = (InOutVariable *)QArrayData::allocate(&local_20,0x68,0x10,in_RDI,in_ESI);
  local_28 = local_20;
  std::
  pair<QTypedArrayData<QShaderDescription::InOutVariable>_*,_QShaderDescription::InOutVariable_*>::
  pair<QTypedArrayData<QShaderDescription::InOutVariable>_*,_QShaderDescription::InOutVariable_*,_true>
            (&local_18,(QTypedArrayData<QShaderDescription::InOutVariable> **)&local_28,&local_30);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    pVar1.second = local_18.second;
    pVar1.first = local_18.first;
    return pVar1;
  }
  __stack_chk_fail();
}

Assistant:

[[nodiscard]] static std::pair<QTypedArrayData *, T *> allocate(qsizetype capacity, AllocationOption option = QArrayData::KeepSize)
    {
        static_assert(sizeof(QTypedArrayData) == sizeof(QArrayData));
        QArrayData *d;
        void *result;
        if constexpr (sizeof(T) == 1) {
            // necessarily, alignof(T) == 1
            result = allocate1(&d, capacity, option);
        } else if constexpr (sizeof(T) == 2) {
            // alignof(T) may be 1, but that makes no difference
            result = allocate2(&d, capacity, option);
        } else {
            result = QArrayData::allocate(&d, sizeof(T), alignof(AlignmentDummy), capacity, option);
        }
#if __has_builtin(__builtin_assume_aligned)
        // and yet we do offer results that have stricter alignment
        result = __builtin_assume_aligned(result, Q_ALIGNOF(AlignmentDummy));
#endif
        return {static_cast<QTypedArrayData *>(d), static_cast<T *>(result)};
    }